

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void QHashPrivate::MultiNode<QByteArray,_QByteArray>::createInPlace<QByteArray>
               (MultiNode<QByteArray,_QByteArray> *n,QByteArray *k,QByteArray *args)

{
  Chain *this;
  
  this = (Chain *)operator_new(0x20);
  QArrayDataPointer<char>::QArrayDataPointer((QArrayDataPointer<char> *)this,&args->d);
  this->next = (MultiNodeChain<QByteArray> *)0x0;
  QArrayDataPointer<char>::QArrayDataPointer((QArrayDataPointer<char> *)n,&k->d);
  n->value = this;
  return;
}

Assistant:

static void createInPlace(MultiNode *n, Key &&k, Args &&... args)
    { new (n) MultiNode(std::move(k), new Chain{ T(std::forward<Args>(args)...), nullptr }); }